

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_add_passphrase.c
# Opt level: O0

void test_archive_read_add_passphrase_set_callback3(void)

{
  int iVar1;
  char *pcVar2;
  undefined4 local_1c;
  archive_read *paStack_18;
  int client_data;
  archive_read *ar;
  archive *a;
  
  paStack_18 = (archive_read *)archive_read_new();
  local_1c = 0;
  ar = paStack_18;
  iVar1 = archive_read_set_passphrase_callback((archive *)paStack_18,&local_1c,callback2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
                      ,L'»',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_passphrase_callback(a, &client_data, callback2)",(void *)0x0
                     );
  __archive_read_reset_passphrase(paStack_18);
  pcVar2 = __archive_read_next_passphrase(paStack_18);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'¿',"passCallBack","\"passCallBack\"",pcVar2,"__archive_read_next_passphrase(ar)",
             (void *)0x0,L'\0');
  __archive_read_reset_passphrase(paStack_18);
  pcVar2 = __archive_read_next_passphrase(paStack_18);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'Â',"passCallBack","\"passCallBack\"",pcVar2,"__archive_read_next_passphrase(ar)",
             (void *)0x0,L'\0');
  pcVar2 = __archive_read_next_passphrase(paStack_18);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_add_passphrase.c"
             ,L'Å',(char *)0x0,"NULL",pcVar2,"__archive_read_next_passphrase(ar)",(void *)0x0,L'\0'
            );
  archive_read_free(&ar->archive);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_add_passphrase_set_callback3)
{
	struct archive* a = archive_read_new();
	struct archive_read *ar = (struct archive_read *)a;
	int client_data = 0;

	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_passphrase_callback(a, &client_data, callback2));

	__archive_read_reset_passphrase(ar);
	/* Fist call, we should get "passCallBack" as a passphrase. */
	assertEqualString("passCallBack", __archive_read_next_passphrase(ar));
	__archive_read_reset_passphrase(ar);
	/* After reset passphrase, we should get "passCallBack" passphrase. */
	assertEqualString("passCallBack", __archive_read_next_passphrase(ar));
	/* Second call, we should get NULL which means all the passphrases
	 * are passed already. */
	assertEqualString(NULL, __archive_read_next_passphrase(ar));

	archive_read_free(a);
}